

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::TextFormat::PrintUnknownFields
               (UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer local_a8;
  
  Printer::Printer(&local_a8);
  bVar1 = Printer::PrintUnknownFields(&local_a8,unknown_fields,output);
  Printer::~Printer(&local_a8);
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, io::ZeroCopyOutputStream* output) {
  return Printer().PrintUnknownFields(unknown_fields, output);
}